

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

TryStmt * new_try_stmt(void *block,List *stmts,void *finally)

{
  Token *pTVar1;
  void *pvVar2;
  TryStmt *pTVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x28);
  pTVar3 = (TryStmt *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = 0;
  *puVar4 = try_eval;
  pTVar1 = (Token *)puVar4[1];
  (pTVar3->node).eval = (eval_handler_)*puVar4;
  (pTVar3->node).token = pTVar1;
  pTVar3->block = block;
  pTVar3->stmts = stmts;
  pTVar3->stmt = finally;
  return pTVar3;
}

Assistant:

TryStmt *new_try_stmt(void *block, List *stmts, void *finally) {
    TryStmt *stmt = new(TryStmt);
    stmt->node = tree_node_(NULL, eval_handler(try_eval));
    stmt->block = block;
    stmt->stmts = stmts;
    stmt->stmt = finally;
    return stmt;
}